

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_globals.cpp
# Opt level: O2

GOs __thiscall
Omega_h::rescan_globals<signed_char>(Omega_h *this,Mesh *mesh,Read<signed_char> *counts)

{
  Alloc *pAVar1;
  int iVar2;
  long lVar3;
  void *extraout_RDX;
  LO LVar4;
  GOs GVar5;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_d1;
  type f;
  Write<long> new_globals_w;
  LOs local_offsets;
  Write<int> local_68;
  Write<signed_char> local_58;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&new_globals_w,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_globals.cpp"
             ,&local_d1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_offsets
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &new_globals_w,":");
  std::__cxx11::to_string(&local_48,10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_offsets
                 ,&local_48);
  begin_code("rescan_globals",(char *)f.new_globals_w.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_offsets);
  std::__cxx11::string::~string((string *)&new_globals_w);
  Write<signed_char>::Write(&local_58,&counts->write_);
  std::__cxx11::string::string((string *)&f,"",(allocator *)&new_globals_w);
  offset_scan<signed_char>((Omega_h *)&local_offsets,(Read<signed_char> *)&local_58,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<signed_char>::~Write(&local_58);
  iVar2 = Read<int>::last((Read<signed_char> *)&local_offsets);
  Mesh::comm((Mesh *)&f);
  lVar3 = Comm::exscan<long>((Comm *)f.new_globals_w.shared_alloc_.alloc,(long)iVar2,OMEGA_H_SUM);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&f.new_globals_w.shared_alloc_.direct_ptr
            );
  pAVar1 = (counts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    LVar4 = (LO)pAVar1->size;
  }
  else {
    LVar4 = (LO)((ulong)pAVar1 >> 3);
  }
  std::__cxx11::string::string((string *)&f,"",(allocator *)&local_48);
  Write<long>::Write(&new_globals_w,LVar4,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<long>::Write((Write<int> *)&f,(Write<int> *)&new_globals_w);
  Write<int>::Write(&f.local_offsets.write_,&local_offsets.write_);
  pAVar1 = (counts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    LVar4 = (LO)pAVar1->size;
  }
  else {
    LVar4 = (LO)((ulong)pAVar1 >> 3);
  }
  f.start = lVar3;
  parallel_for<Omega_h::rescan_globals<signed_char>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (LVar4,&f);
  Write<long>::Write(&local_68,(Write<int> *)&new_globals_w);
  Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_68);
  Write<long>::~Write((Write<long> *)&local_68);
  rescan_globals<signed_char>(Omega_h::Mesh*,Omega_h::Read<signed_char>)::{lambda(int)#1}::~Mesh
            ((_lambda_int__1_ *)&f);
  Write<long>::~Write(&new_globals_w);
  Write<int>::~Write(&local_offsets.write_);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  GVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  GVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (GOs)GVar5.write_.shared_alloc_;
}

Assistant:

GOs rescan_globals(Mesh* mesh, Read<T> counts) {
  OMEGA_H_TIME_FUNCTION;
  auto const local_offsets = offset_scan(counts);
  auto const nnew = local_offsets.last();
  auto const start = mesh->comm()->exscan(GO(nnew), OMEGA_H_SUM);
  auto const new_globals_w = Write<GO>(counts.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    new_globals_w[i] = local_offsets[i] + start;
  };
  parallel_for(counts.size(), std::move(f));
  return new_globals_w;
}